

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O3

void gf256_memswap(void *vx,void *vy,int bytes)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = bytes;
  if (0xf < bytes) {
    do {
      uVar3 = *vx;
      uVar5 = *(undefined8 *)((long)vx + 8);
      uVar6 = *(undefined8 *)((long)vy + 8);
      bytes = uVar8 - 0x10;
      *(undefined8 *)vx = *vy;
      *(undefined8 *)((long)vx + 8) = uVar6;
      *(undefined8 *)vy = uVar3;
      *(undefined8 *)((long)vy + 8) = uVar5;
      vx = (void *)((long)vx + 0x10);
      vy = (void *)((long)vy + 0x10);
      bVar4 = 0x1f < uVar8;
      uVar8 = bytes;
    } while (bVar4);
  }
  uVar7 = (ulong)(bytes & 8U);
  if ((bytes & 8U) != 0) {
    uVar3 = *vx;
    *(undefined8 *)vx = *vy;
    *(undefined8 *)vy = uVar3;
  }
  if ((bytes & 4U) != 0) {
    uVar2 = *(undefined4 *)((long)vx + uVar7);
    *(undefined4 *)((long)vx + uVar7) = *(undefined4 *)((long)vy + uVar7);
    *(undefined4 *)((long)vy + uVar7) = uVar2;
  }
  uVar7 = (ulong)(bytes & 0xc);
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    uVar1 = *(undefined1 *)((long)vx + uVar7 + 2);
    *(undefined1 *)((long)vx + uVar7 + 2) = *(undefined1 *)((long)vy + uVar7 + 2);
    *(undefined1 *)((long)vy + uVar7 + 2) = uVar1;
  case 2:
    uVar1 = *(undefined1 *)((long)vx + uVar7 + 1);
    *(undefined1 *)((long)vx + uVar7 + 1) = *(undefined1 *)((long)vy + uVar7 + 1);
    *(undefined1 *)((long)vy + uVar7 + 1) = uVar1;
  case 1:
    uVar1 = *(undefined1 *)((long)vx + uVar7);
    *(undefined1 *)((long)vx + uVar7) = *(undefined1 *)((long)vy + uVar7);
    *(undefined1 *)((long)vy + uVar7) = uVar1;
    return;
  }
}

Assistant:

void gf256_memswap(void * GF256_RESTRICT vx, void * GF256_RESTRICT vy, int bytes)
{
#if defined(GF256_TARGET_MOBILE)
    uint64_t * GF256_RESTRICT x16 = reinterpret_cast<uint64_t *>(vx);
    uint64_t * GF256_RESTRICT y16 = reinterpret_cast<uint64_t *>(vy);

    const unsigned count = (unsigned)bytes / 8;
    for (unsigned ii = 0; ii < count; ++ii)
    {
        const uint64_t temp = x16[ii];
        x16[ii] = y16[ii];
        y16[ii] = temp;
    }

    x16 += count;
    y16 += count;
    bytes -= count * 8;
#else
    GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<GF256_M128 *>(vx);
    GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<GF256_M128 *>(vy);

    // Handle blocks of 16 bytes
    while (bytes >= 16)
    {
        GF256_M128 x0 = _mm_loadu_si128(x16);
        GF256_M128 y0 = _mm_loadu_si128(y16);
        _mm_storeu_si128(x16, y0);
        _mm_storeu_si128(y16, x0);

        bytes -= 16, ++x16, ++y16;
    }
#endif

    uint8_t * GF256_RESTRICT x1 = reinterpret_cast<uint8_t *>(x16);
    uint8_t * GF256_RESTRICT y1 = reinterpret_cast<uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT x8 = reinterpret_cast<uint64_t *>(x1);
        uint64_t * GF256_RESTRICT y8 = reinterpret_cast<uint64_t *>(y1);

        uint64_t temp = *x8;
        *x8 = *y8;
        *y8 = temp;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT x4 = reinterpret_cast<uint32_t *>(x1 + eight);
        uint32_t * GF256_RESTRICT y4 = reinterpret_cast<uint32_t *>(y1 + eight);

        uint32_t temp = *x4;
        *x4 = *y4;
        *y4 = temp;
    }

    // Handle final bytes
    const int offset = eight + four;
    uint8_t temp;
    switch (bytes & 3)
    {
    case 3: temp = x1[offset + 2]; x1[offset + 2] = y1[offset + 2]; y1[offset + 2] = temp;
    case 2: temp = x1[offset + 1]; x1[offset + 1] = y1[offset + 1]; y1[offset + 1] = temp;
    case 1: temp = x1[offset]; x1[offset] = y1[offset]; y1[offset] = temp;
    default:
        break;
    }
}